

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPResponse.cpp
# Opt level: O3

bool __thiscall SNMPResponse::addErrorResponse(SNMPResponse *this,VarBind *response)

{
  _Map_pointer ppVVar1;
  _Map_pointer ppVVar2;
  _Elt_pointer pVVar3;
  _Elt_pointer pVVar4;
  _Elt_pointer pVVar5;
  _Elt_pointer pVVar6;
  
  ppVVar1 = (this->super_SNMPPacket).varbindList.
            super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node;
  ppVVar2 = (this->super_SNMPPacket).varbindList.
            super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node;
  pVVar3 = (this->super_SNMPPacket).varbindList.super__Deque_base<VarBind,_std::allocator<VarBind>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pVVar4 = (this->super_SNMPPacket).varbindList.super__Deque_base<VarBind,_std::allocator<VarBind>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pVVar5 = (this->super_SNMPPacket).varbindList.super__Deque_base<VarBind,_std::allocator<VarBind>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pVVar6 = (this->super_SNMPPacket).varbindList.super__Deque_base<VarBind,_std::allocator<VarBind>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  std::deque<VarBind,std::allocator<VarBind>>::emplace_back<VarBind_const&>
            ((deque<VarBind,std::allocator<VarBind>> *)&(this->super_SNMPPacket).varbindList,
             response);
  if (response->errorStatus != NO_ERROR) {
    (this->super_SNMPPacket).errorStatus.errorStatus = response->errorStatus;
    (this->super_SNMPPacket).errorIndex.errorIndex =
         (int)((ulong)((long)pVVar3 - (long)pVVar4) >> 4) * -0x55555555 +
         ((int)((ulong)((long)ppVVar1 - (long)ppVVar2) >> 3) + -1 +
         (uint)(ppVVar1 == (_Map_pointer)0x0)) * 10 +
         (int)((ulong)((long)pVVar6 - (long)pVVar5) >> 4) * -0x55555555 + 1;
  }
  return true;
}

Assistant:

bool SNMPResponse::addErrorResponse(const VarBind& response){
    int index = this->varbindList.size() + 1;
    this->varbindList.emplace_back(response);
    
    if(response.errorStatus != NO_ERROR){
        this->errorStatus.errorStatus = response.errorStatus;
        this->errorIndex.errorIndex = index;
    }
    return true;
}